

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O2

JsErrorCode JsDiagRequestAsyncBreak(JsRuntimeHandle runtimeHandle)

{
  ScriptContext *scriptContext;
  bool bVar1;
  int iVar2;
  JsrtRuntime *this;
  JsrtDebugManager *this_00;
  JsErrorCode JVar3;
  ScriptContext **ppSVar4;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar3 = JsErrorInvalidArgument;
  }
  else {
    this = JsrtRuntime::FromHandle(runtimeHandle);
    this_00 = JsrtRuntime::GetJsrtDebugManager(this);
    JVar3 = JsErrorDiagNotInDebugMode;
    if (this_00 != (JsrtDebugManager *)0x0) {
      bVar1 = JsrtDebugManager::IsDebugEventCallbackSet(this_00);
      if (bVar1) {
        ppSVar4 = &this->threadContext->scriptContextList;
        while (scriptContext = *ppSVar4, JVar3 = JsNoError, scriptContext != (ScriptContext *)0x0) {
          iVar2 = (*(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])
                            (scriptContext);
          JVar3 = JsNoError;
          if ((char)iVar2 != '\0') break;
          JsrtDebugManager::EnableAsyncBreak(this_00,scriptContext);
          ppSVar4 = &scriptContext->next;
        }
      }
    }
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar3;
}

Assistant:

CHAKRA_API JsDiagRequestAsyncBreak(
    _In_ JsRuntimeHandle runtimeHandle)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {

        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        for (Js::ScriptContext *scriptContext = runtime->GetThreadContext()->GetScriptContextList();
        scriptContext != nullptr && !scriptContext->IsClosed();
            scriptContext = scriptContext->next)
        {
            jsrtDebugManager->EnableAsyncBreak(scriptContext);
        }

        return JsNoError;
    });
#endif
}